

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall
Rml::ElementScroll::UpdateScrollElementProperties(ElementScroll *this,Element *scroll_element)

{
  float local_44;
  Vector2i local_34;
  Vector2f local_2c;
  Vector2f vp_dimensions;
  float dp_ratio;
  Context *context;
  Element *scroll_element_local;
  ElementScroll *this_local;
  
  register0x00000000 = Element::GetContext(this->element);
  if (register0x00000000 == (Context *)0x0) {
    local_44 = 1.0;
  }
  else {
    local_44 = Context::GetDensityIndependentPixelRatio(register0x00000000);
  }
  vp_dimensions.x = local_44;
  if (stack0xffffffffffffffe0 == (Context *)0x0) {
    Vector2<float>::Vector2(&local_2c,1.0);
  }
  else {
    local_34 = Context::GetDimensions(stack0xffffffffffffffe0);
    local_2c = Vector2::operator_cast_to_Vector2((Vector2 *)&local_34);
  }
  Element::Update(scroll_element,vp_dimensions.x,local_2c);
  return;
}

Assistant:

void ElementScroll::UpdateScrollElementProperties(Element* scroll_element)
{
	// The construction of scrollbars can occur during layouting, then we need some properties and computed values straight away.
	// In particular their size. Furthermore, updating these properties straight away avoids dirtying the document after layouting,
	// which may result in one less additional and unnecessary layouting procedure.

	Context* context = element->GetContext();

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));
	scroll_element->Update(dp_ratio, vp_dimensions);
}